

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  int iVar4;
  Verbosity VVar5;
  int *piVar6;
  streamsize sVar7;
  cpp_dec_float<200U,_int,_void> *u;
  cpp_dec_float<200U,_int,_void> *this_00;
  SPxOut *i_00;
  long in_RDI;
  streamsize prec;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  Status stat;
  int i;
  int sparsitythreshold;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  Desc *ds;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffa88;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffa90;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffaa0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffaa8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffab0;
  int local_528;
  int local_524;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_520;
  undefined1 local_4a0 [64];
  double in_stack_fffffffffffffba0;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffba8;
  undefined4 local_410;
  Verbosity local_40c;
  undefined1 local_408 [112];
  Status in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc70;
  undefined4 local_388;
  Verbosity local_384;
  undefined1 local_380 [128];
  undefined1 local_300 [128];
  undefined8 local_280;
  Status local_274;
  int local_270;
  int local_26c;
  undefined1 local_268 [128];
  int local_1e8;
  undefined4 local_1e4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e0;
  Desc *local_160;
  undefined8 local_150;
  int *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined4 *local_138;
  long local_130;
  undefined1 *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  undefined4 *local_118;
  int *local_110;
  undefined8 *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined8 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  int *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_160 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI + 0x238));
  leavetol(in_stack_fffffffffffffaa8);
  *(undefined1 *)(in_RDI + 0x800) = 1;
  local_1e4 = 0;
  local_130 = in_RDI + 0x780;
  local_138 = &local_1e4;
  local_118 = local_138;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffa90,
             (long_long_type)in_stack_fffffffffffffa88);
  IdxSet::clear((IdxSet *)(in_RDI + 0x13a0));
  local_26c = coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x6a8328);
  local_70 = local_268;
  local_80 = &local_26c;
  local_78 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0xb7c);
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_81,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0xb7c));
  local_68 = local_268;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffa90);
  local_50 = local_268;
  local_58 = local_78;
  local_60 = local_80;
  local_90 = (long)*local_80;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
             (longlong *)0x6a83f0);
  local_1e8 = boost::multiprecision::number::operator_cast_to_int
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6a83fd);
  for (local_270 = 0; iVar4 = local_270,
      iVar3 = coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x6a8424), iVar4 < iVar3; local_270 = local_270 + 1) {
    local_274 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Desc::status((Desc *)in_stack_fffffffffffffa90,
                               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20));
    bVar1 = isBasic(in_stack_fffffffffffffa90,(Status)((ulong)in_stack_fffffffffffffa88 >> 0x20));
    if (bVar1) {
      local_280 = 0;
      local_100 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffffa90,
                               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20));
      local_108 = &local_280;
      local_f8 = local_108;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
      if (*(int *)(in_RDI + 0x1440) == 0) {
        piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1418),local_270);
        *piVar6 = 0;
      }
    }
    else {
      test(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
      local_120 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffffa90,
                               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20));
      local_128 = local_300;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffa90,
                 in_stack_fffffffffffffa88);
      iVar4 = (int)((ulong)in_stack_fffffffffffffa88 >> 0x20);
      if (*(int *)(in_RDI + 0x1440) == 0) {
        in_stack_fffffffffffffab0 =
             VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffffa90,iVar4);
        local_b0 = local_380;
        local_b8 = &local_1e0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_b9,local_b8);
        local_a0 = local_380;
        local_a8 = local_b8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffa90,
                   in_stack_fffffffffffffa88);
        local_98 = local_380;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffa90);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffffa88,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6a862a);
        if (tVar2) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffa90,(int)((ulong)in_stack_fffffffffffffa88 >> 0x20))
          ;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=(in_stack_fffffffffffffab0,(self_type *)in_stack_fffffffffffffaa8);
          DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffffa90,
                          (int)((ulong)in_stack_fffffffffffffa88 >> 0x20));
          piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1418),local_270);
          *piVar6 = 1;
          *(int *)(in_RDI + 0x804) = *(int *)(in_RDI + 0x804) + 1;
        }
        else {
          piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1418),local_270);
          *piVar6 = 0;
        }
        iVar4 = IdxSet::size((IdxSet *)(in_RDI + 0x13a0));
        if (local_1e8 < iVar4) {
          if ((*(long *)(in_RDI + 0x14b0) != 0) &&
             (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x14b0)), 3 < (int)VVar5)) {
            local_384 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x14b0));
            local_388 = 4;
            (**(code **)(**(long **)(in_RDI + 0x14b0) + 0x10))
                      (*(long **)(in_RDI + 0x14b0),&local_388);
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffa90,
                               (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffa88);
            (**(code **)(**(long **)(in_RDI + 0x14b0) + 0x10))
                      (*(long **)(in_RDI + 0x14b0),&local_384);
          }
          *(undefined4 *)(in_RDI + 0x1440) = 5;
          *(undefined1 *)(in_RDI + 0x1432) = 0;
          IdxSet::clear((IdxSet *)(in_RDI + 0x13a0));
        }
      }
      else {
        in_stack_fffffffffffffaa8 =
             (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffffa90,iVar4);
        local_e0 = local_408;
        local_e8 = &local_1e0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_e9,local_e8);
        local_d0 = local_408;
        local_d8 = local_e8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffa90,
                   in_stack_fffffffffffffa88);
        local_c8 = local_408;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffa90);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffffa88,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6a8879);
        if (tVar2) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffa90,(int)((ulong)in_stack_fffffffffffffa88 >> 0x20))
          ;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=(in_stack_fffffffffffffab0,(self_type *)in_stack_fffffffffffffaa8);
          *(int *)(in_RDI + 0x804) = *(int *)(in_RDI + 0x804) + 1;
        }
      }
    }
  }
  iVar4 = IdxSet::size((IdxSet *)(in_RDI + 0x13a0));
  if ((iVar4 == 0) && ((*(byte *)(in_RDI + 0x1432) & 1) == 0)) {
    *(int *)(in_RDI + 0x1440) = *(int *)(in_RDI + 0x1440) + -1;
  }
  else {
    iVar4 = IdxSet::size((IdxSet *)(in_RDI + 0x13a0));
    if ((iVar4 <= local_1e8) && ((*(byte *)(in_RDI + 0x1432) & 1) == 0)) {
      if ((*(long *)(in_RDI + 0x14b0) != 0) &&
         (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x14b0)), 3 < (int)VVar5)) {
        local_40c = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x14b0));
        local_410 = 4;
        (**(code **)(**(long **)(in_RDI + 0x14b0) + 0x10))(*(long **)(in_RDI + 0x14b0),&local_410);
        sVar7 = SPxOut::precision((SPxOut *)0x6a89cb);
        if ((*(byte *)(in_RDI + 0x1434) & 1) == 0) {
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
        }
        else {
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88);
        }
        u = (cpp_dec_float<200U,_int,_void> *)
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88
                              );
        std::setw(6);
        soplex::operator<<((SPxOut *)u,(_Setw)(int)((ulong)in_stack_fffffffffffffa90 >> 0x20));
        this_00 = (cpp_dec_float<200U,_int,_void> *)
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffa90,
                                     (_func_ios_base_ptr_ios_base_ptr *)u);
        std::setprecision(4);
        i_00 = soplex::operator<<((SPxOut *)u,(_Setprecision)(int)((ulong)this_00 >> 0x20));
        local_524 = IdxSet::size((IdxSet *)(in_RDI + 0x13a0));
        local_140 = &local_520;
        local_148 = &local_524;
        local_150 = 0;
        local_110 = local_148;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (in_stack_fffffffffffffaa0,(longlong)i_00,this_00);
        local_528 = coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x6a8aff);
        local_28 = local_4a0;
        local_30 = &local_520;
        local_38 = &local_528;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30);
        local_20 = local_4a0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00);
        local_8 = local_4a0;
        local_10 = local_30;
        local_18 = local_38;
        local_48 = (long)*local_38;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  (this_00,u,(longlong *)0x6a8bbf);
        soplex::operator<<((SPxOut *)this_00,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)u);
        soplex::operator<<((SPxOut *)this_00,(_func_ios_base_ptr_ios_base_ptr *)u);
        std::setprecision((int)sVar7);
        soplex::operator<<((SPxOut *)u,(_Setprecision)(int)((ulong)this_00 >> 0x20));
        soplex::operator<<((SPxOut *)this_00,(_func_ostream_ptr_ostream_ptr *)u);
        (**(code **)(**(long **)(in_RDI + 0x14b0) + 0x10))(*(long **)(in_RDI + 0x14b0),&local_40c);
      }
      *(undefined1 *)(in_RDI + 0x1432) = 1;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeTest()
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();
   m_pricingViolCoUpToDate = true;
   m_pricingViolCo = 0;

   infeasibilitiesCo.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * coDim());

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(isBasic(stat))
      {
         theTest[i] = 0.0;

         if(remainingRoundsEnterCo == 0)
            isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         assert(!isBasic(stat));
         theTest[i] = test(i, stat);

         if(remainingRoundsEnterCo == 0)
         {
            if(theTest[i] < -pricingTol)
            {
               assert(infeasibilitiesCo.size() < infeasibilitiesCo.max());
               m_pricingViolCo -= theTest[i];
               infeasibilitiesCo.addIdx(i);
               isInfeasibleCo[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilitiesCo.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnterCo = SOPLEX_DENSEROUNDS;
               sparsePricingEnterCo = false;
               infeasibilitiesCo.clear();
            }
         }
         else if(theTest[i] < -pricingTol)
         {
            m_pricingViolCo -= theTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilitiesCo.size() == 0 && !sparsePricingEnterCo)
      --remainingRoundsEnterCo;
   else if(infeasibilitiesCo.size() <= sparsitythreshold && !sparsePricingEnterCo)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilitiesCo.size() / coDim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnterCo = true;
   }
}